

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

Mio_Library_t * Abc_SclDeriveGenlibSimple(void *pScl)

{
  char *FileName;
  undefined8 uVar1;
  uint uVar2;
  Vec_Str_t *p_00;
  char *pBuffer;
  Mio_Library_t *pMVar3;
  Mio_Library_t *pLib;
  Vec_Str_t *vStr;
  SC_Lib *p;
  void *pScl_local;
  
  p_00 = Abc_SclProduceGenlibStrSimple((SC_Lib *)pScl);
  FileName = *(char **)((long)pScl + 8);
  pBuffer = Vec_StrArray(p_00);
  pMVar3 = Mio_LibraryRead(FileName,pBuffer,(char *)0x0,0);
  Vec_StrFree(p_00);
  if (pMVar3 == (Mio_Library_t *)0x0) {
    printf("Reading library has filed.\n");
  }
  else {
    uVar1 = *pScl;
    uVar2 = SC_LibCellNum((SC_Lib *)pScl);
    printf("Derived GENLIB library \"%s\" with %d gates.\n",uVar1,(ulong)uVar2);
  }
  return pMVar3;
}

Assistant:

Mio_Library_t * Abc_SclDeriveGenlibSimple( void * pScl )
{
    SC_Lib * p = (SC_Lib *)pScl;
    Vec_Str_t * vStr = Abc_SclProduceGenlibStrSimple( p );
    Mio_Library_t * pLib = Mio_LibraryRead( p->pFileName, Vec_StrArray(vStr), NULL, 0 );  
    Vec_StrFree( vStr );
    if ( pLib )
        printf( "Derived GENLIB library \"%s\" with %d gates.\n", p->pName, SC_LibCellNum(p) );
    else
        printf( "Reading library has filed.\n" );
    return pLib;
}